

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f __thiscall Quat4f::conjugated(Quat4f *this)

{
  float fVar1;
  float fVar2;
  float *in_RDI;
  Quat4f QVar3;
  
  QVar3.m_elements[1] = 0.0;
  QVar3.m_elements[0] = this->m_elements[0];
  QVar3.m_elements[2] = -this->m_elements[1];
  QVar3.m_elements[3] = -0.0;
  fVar1 = this->m_elements[2];
  fVar2 = this->m_elements[3];
  *in_RDI = this->m_elements[0];
  in_RDI[1] = QVar3.m_elements[2];
  in_RDI[2] = -fVar1;
  in_RDI[3] = -fVar2;
  return (Quat4f)QVar3.m_elements;
}

Assistant:

Quat4f Quat4f::conjugated() const
{
	return Quat4f
	(
		 m_elements[ 0 ],
		-m_elements[ 1 ],
		-m_elements[ 2 ],
		-m_elements[ 3 ]
	);
}